

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NitfIsd.h
# Opt level: O2

void __thiscall csm::Image::~Image(Image *this)

{
  std::vector<csm::Tre,_std::allocator<csm::Tre>_>::~vector
            ((vector<csm::Tre,_std::allocator<csm::Tre>_> *)(this + 0x20));
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Image() {}